

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetTenor
          (FXBase *this,string *tenor_key,string *settlement_key,Tenor *tenor)

{
  size_t __n;
  FX *pFVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  Tenor *pTVar5;
  ostream *poVar6;
  InvalidSubjectException *pIVar7;
  string far_tenor;
  stringstream ss;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  Tenor::ToString_abi_cxx11_((string *)local_1b8,tenor);
  Tenor::ToString_abi_cxx11_(&local_1f8,(Tenor *)&Tenor::BROKEN_DATE);
  _Var2._M_p = local_1f8._M_dataplus._M_p;
  if ((local_1b8._8_8_ == local_1f8._M_string_length) &&
     ((local_1b8._8_8_ == 0 ||
      (iVar4 = bcmp((void *)local_1b8._0_8_,local_1f8._M_dataplus._M_p,local_1b8._8_8_), iVar4 == 0)
      ))) {
    bVar3 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       settlement_key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->outer_class_->super_MandatoryFieldsSubjectCreator).mandatory_keys_,
                  settlement_key);
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p != &local_1f8.field_2) {
      operator_delete(_Var2._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  __n = tenor_key->_M_string_length;
  if ((__n == DAT_001ec440) &&
     ((__n == 0 ||
      (iVar4 = bcmp((tenor_key->_M_dataplus)._M_p,SubjectKey::FAR_TENOR_abi_cxx11_,__n), iVar4 == 0)
      ))) {
    bVar3 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       (string *)&SubjectKey::TENOR_abi_cxx11_);
    if (!bVar3) goto LAB_0019dc14;
    SubjectBuilder::GetComponent
              (&local_1f8,
               &(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
               (string *)&SubjectKey::TENOR_abi_cxx11_);
    pTVar5 = Tenor::GetTenorFromString(&local_1f8);
    bVar3 = Tenor::IsValidNearFarTenor(pTVar5,tenor);
    if (!bVar3) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"Invalid near/far tenor combination: [TENOR] ",0x2c);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b8 + 0x10),local_1f8._M_dataplus._M_p,
                          local_1f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," [FAR] ",7);
      Tenor::ToString_abi_cxx11_(&local_1d8,tenor);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      pIVar7 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      InvalidSubjectException::InvalidSubjectException(pIVar7,&local_1d8);
      __cxa_throw(pIVar7,&InvalidSubjectException::typeinfo,
                  InvalidSubjectException::~InvalidSubjectException);
    }
  }
  else {
    if ((__n != DAT_001ec620) ||
       ((__n != 0 &&
        (iVar4 = bcmp((tenor_key->_M_dataplus)._M_p,SubjectKey::TENOR_abi_cxx11_,__n), iVar4 != 0)))
       ) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"Invalid tenor key: ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),(tenor_key->_M_dataplus)._M_p,
                 tenor_key->_M_string_length);
      pIVar7 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      InvalidSubjectException::InvalidSubjectException(pIVar7,&local_1f8);
      __cxa_throw(pIVar7,&InvalidSubjectException::typeinfo,
                  InvalidSubjectException::~InvalidSubjectException);
    }
    bVar3 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       (string *)&SubjectKey::FAR_TENOR_abi_cxx11_);
    if (!bVar3) goto LAB_0019dc14;
    SubjectBuilder::GetComponent
              (&local_1f8,
               &(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
               (string *)&SubjectKey::FAR_TENOR_abi_cxx11_);
    pTVar5 = Tenor::GetTenorFromString(&local_1f8);
    bVar3 = Tenor::IsValidNearFarTenor(tenor,pTVar5);
    if (!bVar3) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"Invalid near/far tenor combination: [TENOR] ",0x2c);
      Tenor::ToString_abi_cxx11_(&local_1d8,tenor);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b8 + 0x10),local_1d8._M_dataplus._M_p,
                          local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," [FAR] ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      pIVar7 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      InvalidSubjectException::InvalidSubjectException(pIVar7,&local_1d8);
      __cxa_throw(pIVar7,&InvalidSubjectException::typeinfo,
                  InvalidSubjectException::~InvalidSubjectException);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
LAB_0019dc14:
  pFVar1 = this->outer_class_;
  Tenor::ToString_abi_cxx11_((string *)local_1b8,tenor);
  SubjectBuilder::SetComponent
            (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,tenor_key,
             (string *)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::SetTenor(const std::string& tenor_key, const std::string& settlement_key, const Tenor& tenor)
{
    if (tenor.ToString() == Tenor::BROKEN_DATE.ToString() && !outer_class_.subject_builder_.ContainsKey(settlement_key))
    {
        outer_class_.AddMandatoryKey(settlement_key);
    }

    if (tenor_key == SubjectKey::FAR_TENOR)
    {
        if (outer_class_.subject_builder_.ContainsKey(SubjectKey::TENOR))
        {
            std::string near_tenor = outer_class_.subject_builder_.GetComponent(SubjectKey::TENOR);

            if (!Tenor::IsValidNearFarTenor(Tenor::GetTenorFromString(near_tenor), tenor))
            {
                std::stringstream ss;
                ss << "Invalid near/far tenor combination: [TENOR] " <<  near_tenor << " [FAR] " << tenor.ToString();
                throw InvalidSubjectException(ss.str());
            }
        }
    }
    else if (tenor_key == SubjectKey::TENOR)
    {
        if (outer_class_.subject_builder_.ContainsKey(SubjectKey::FAR_TENOR))
        {
            std::string far_tenor = outer_class_.subject_builder_.GetComponent(SubjectKey::FAR_TENOR);

            if (!Tenor::IsValidNearFarTenor(tenor, Tenor::GetTenorFromString(far_tenor)))
            {
                std::stringstream ss;
                ss << "Invalid near/far tenor combination: [TENOR] " <<  tenor.ToString() << " [FAR] " << far_tenor;
                throw InvalidSubjectException(ss.str());
            }
        }
    }
    else
    {
        std::stringstream ss;
        ss << "Invalid tenor key: " <<  tenor_key;
        throw InvalidSubjectException(ss.str());
    }

    outer_class_.subject_builder_.SetComponent(tenor_key, tenor.ToString());
}